

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit_percent.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalLimitPercent::GetData
          (PhysicalLimitPercent *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  __pthread_internal_list **this_00;
  vector<duckdb::InterruptState,_true> *current_offset;
  GlobalSourceState *pGVar1;
  pointer pIVar2;
  bool bVar3;
  pointer pGVar4;
  pointer pIVar5;
  idx_t iVar6;
  ulong uVar7;
  OutOfRangeException *this_01;
  InterruptMode *index;
  undefined1 *index_00;
  SourceResultType SVar8;
  undefined1 auVar9 [16];
  double dVar10;
  allocator local_59;
  DataChunk *local_58;
  string local_50;
  
  pGVar4 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalOperator).sink_state);
  pGVar1 = input->global_state;
  this_00 = &pGVar1[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
             __next;
  if (pGVar1[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__next
      == (__pthread_internal_list *)0xffffffffffffffff) {
    if (pGVar4[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[0x20] !=
        '\x01') {
      return FINISHED;
    }
    pIVar2 = pGVar4[1].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_58 = chunk;
    if (pIVar2 == (pointer)0x0) {
      index = (InterruptMode *)0x0;
    }
    else {
      iVar6 = optional_idx::GetIndex((optional_idx *)&pGVar4[1].super_StateWithBlockableTasks.lock);
      index = &pIVar2->mode + iVar6;
    }
    bVar3 = Value::IsNan<double>(*(double *)&pGVar4[1].super_StateWithBlockableTasks);
    chunk = local_58;
    if (((bVar3) || (dVar10 = *(double *)&pGVar4[1].super_StateWithBlockableTasks, dVar10 < 0.0)) ||
       (100.0 < dVar10)) {
      this_01 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Limit percent out of range, should be between 0% and 100%",
                 &local_59);
      OutOfRangeException::OutOfRangeException(this_01,&local_50);
      __cxa_throw(this_01,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    auVar9._8_4_ = (int)((ulong)index >> 0x20);
    auVar9._0_8_ = index;
    auVar9._12_4_ = 0x45300000;
    dVar10 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)index) - 4503599627370496.0)) * (dVar10 / 100.0);
    uVar7 = (ulong)dVar10;
    index_00 = (undefined1 *)((long)(dVar10 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7);
    if (index < index_00) {
      optional_idx::optional_idx((optional_idx *)&local_50,(idx_t)index);
    }
    else {
      optional_idx::optional_idx((optional_idx *)&local_50,(idx_t)index_00);
    }
    *this_00 = (__pthread_internal_list *)local_50._M_dataplus._M_p;
    if (local_50._M_dataplus._M_p == (pointer)0x0) {
      return FINISHED;
    }
  }
  current_offset = &pGVar1[2].super_StateWithBlockableTasks.blocked_tasks;
  pIVar2 = (current_offset->
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pIVar5 = (pointer)optional_idx::GetIndex((optional_idx *)this_00);
  if (pIVar2 < pIVar5) {
    bVar3 = ColumnDataCollection::Scan
                      ((ColumnDataCollection *)
                       ((long)&pGVar4[1].super_StateWithBlockableTasks.lock.super___mutex_base.
                               _M_mutex + 8),(ColumnDataScanState *)(pGVar1 + 1),chunk);
    SVar8 = FINISHED;
    if (bVar3) {
      iVar6 = optional_idx::GetIndex((optional_idx *)this_00);
      SVar8 = HAVE_MORE_OUTPUT;
      PhysicalLimit::HandleOffset(chunk,(idx_t *)current_offset,0,iVar6);
    }
  }
  else {
    SVar8 = FINISHED;
  }
  return SVar8;
}

Assistant:

SourceResultType PhysicalLimitPercent::GetData(ExecutionContext &context, DataChunk &chunk,
                                               OperatorSourceInput &input) const {
	auto &gstate = sink_state->Cast<LimitPercentGlobalState>();
	auto &state = input.global_state.Cast<LimitPercentOperatorState>();
	auto &percent_limit = gstate.limit_percent;
	auto &offset = gstate.offset;
	auto &limit = state.limit;
	auto &current_offset = state.current_offset;

	if (!limit.IsValid()) {
		if (!gstate.is_limit_set) {
			// no limit value and we have not set limit_percent
			// we are running LIMIT % with a subquery over an empty table
			D_ASSERT(gstate.data.Count() == 0);
			return SourceResultType::FINISHED;
		}
		idx_t count = gstate.data.Count();
		if (count > 0) {
			count += offset.GetIndex();
		}
		if (Value::IsNan(percent_limit) || percent_limit < 0 || percent_limit > 100) {
			throw OutOfRangeException("Limit percent out of range, should be between 0% and 100%");
		}
		auto limit_percentage = idx_t(percent_limit / 100.0 * double(count));
		if (limit_percentage > count) {
			limit = count;
		} else {
			limit = idx_t(limit_percentage);
		}
		if (limit == 0) {
			return SourceResultType::FINISHED;
		}
	}

	if (current_offset >= limit.GetIndex()) {
		return SourceResultType::FINISHED;
	}
	if (!gstate.data.Scan(state.scan_state, chunk)) {
		return SourceResultType::FINISHED;
	}

	PhysicalLimit::HandleOffset(chunk, current_offset, 0, limit.GetIndex());

	return SourceResultType::HAVE_MORE_OUTPUT;
}